

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O3

bool axl::io::getSymbolicLinkTarget(String *targetName,StringRef *linkName)

{
  int iVar1;
  C *pCVar2;
  C *__buf;
  ssize_t sVar3;
  size_t length;
  stat linkStat;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_e8;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_d0;
  stat local_b8;
  
  memset(&local_b8,0,0x90);
  if (linkName->m_length == 0) {
    pCVar2 = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  else {
    pCVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                       (linkName);
  }
  iVar1 = lstat(pCVar2,&local_b8);
  if (iVar1 != -1) {
    if ((local_b8.st_mode & 0xf000) != 0xa000) {
      err::Error::Error((Error *)&local_d0,0x16);
      local_e8.m_p = (ErrorHdr *)0x0;
      local_e8.m_hdr = (BufHdr *)0x0;
      local_e8.m_size = 0;
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_e8,&local_d0);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_d0);
      err::setError((ErrorRef *)&local_e8);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_e8);
      return false;
    }
    length = 0x1000;
    if (local_b8.st_size != 0) {
      length = local_b8.st_size;
    }
    __buf = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
                      (targetName,length,false);
    if (__buf == (C *)0x0) {
      return false;
    }
    if (linkName->m_length == 0) {
      pCVar2 = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    }
    else {
      pCVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                         (linkName);
    }
    sVar3 = readlink(pCVar2,__buf,length);
    if ((int)sVar3 != -1) {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::overrideLength
                (targetName,(long)(int)sVar3);
      return true;
    }
  }
  err::setLastSystemError();
  return false;
}

Assistant:

bool
getSymbolicLinkTarget(
	sl::String* targetName,
	const sl::StringRef& linkName
) {
	struct stat linkStat = { 0 };

	int result = ::lstat(linkName.sz(), &linkStat);
	if (result == -1)
		return err::failWithLastSystemError();

	if (!S_ISLNK(linkStat.st_mode))
		return err::fail(EINVAL);

	size_t bufferLength = linkStat.st_size ? linkStat.st_size : PATH_MAX;

	char* p = targetName->createBuffer(bufferLength);
	if (!p)
		return false;

	result = readlink(linkName.sz(), p, bufferLength);
	if (result == -1)
		return err::failWithLastSystemError();

	ASSERT(result <= bufferLength);
	targetName->overrideLength(result);
	return true;
}